

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

void __thiscall Float_ExponentCannotBeEmpty_Test::TestBody(Float_ExponentCannotBeEmpty_Test *this)

{
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Float_ExponentCannotBeEmpty_Test *local_10;
  Float_ExponentCannotBeEmpty_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"1e",&local_31);
  anon_unknown.dwarf_777f8::test_error(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"1e+",&local_69);
  anon_unknown.dwarf_777f8::test_error(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"1e-",&local_91);
  anon_unknown.dwarf_777f8::test_error(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

TEST(Float, ExponentCannotBeEmpty) {
    test_error("1e");
    test_error("1e+");
    test_error("1e-");
}